

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O0

FL_BLINE * __thiscall Fl_Browser::find_line(Fl_Browser *this,int line)

{
  Fl_Browser *local_28;
  FL_BLINE *l;
  int n;
  int line_local;
  Fl_Browser *this_local;
  
  if (line == this->cacheline) {
    this_local = (Fl_Browser *)this->cache;
  }
  else {
    if (((this->cacheline == 0) || (line <= this->cacheline / 2)) ||
       ((this->cacheline + this->lines) / 2 <= line)) {
      if (this->lines / 2 < line) {
        l._0_4_ = this->lines;
        local_28 = (Fl_Browser *)this->last;
      }
      else {
        l._0_4_ = 1;
        local_28 = (Fl_Browser *)this->first;
      }
    }
    else {
      l._0_4_ = this->cacheline;
      local_28 = (Fl_Browser *)this->cache;
    }
    for (; (int)l < line && local_28 != (Fl_Browser *)0x0; l._0_4_ = (int)l + 1) {
      local_28 = (Fl_Browser *)(local_28->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget.parent_;
    }
    for (; line < (int)l && local_28 != (Fl_Browser *)0x0; l._0_4_ = (int)l + -1) {
      local_28 = (Fl_Browser *)
                 (local_28->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget;
    }
    this->cacheline = line;
    this->cache = (FL_BLINE *)local_28;
    this_local = local_28;
  }
  return (FL_BLINE *)this_local;
}

Assistant:

FL_BLINE* Fl_Browser::find_line(int line) const {
  int n; FL_BLINE* l;
  if (line == cacheline) return cache;
  if (cacheline && line > (cacheline/2) && line < ((cacheline+lines)/2)) {
    n = cacheline; l = cache;
  } else if (line <= (lines/2)) {
    n = 1; l = first;
  } else {
    n = lines; l = last;
  }
  for (; n < line && l; n++) l = l->next;
  for (; n > line && l; n--) l = l->prev;
  ((Fl_Browser*)this)->cacheline = line;
  ((Fl_Browser*)this)->cache = l;
  return l;
}